

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::OP_LoadUndefinedToElement(Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *this;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  undefined4 *puVar3;
  undefined1 local_38 [8];
  JsReentLock reentrancylock;
  PropertyId propertyId_local;
  Var instance_local;
  
  reentrancylock._28_4_ = propertyId;
  this = VarTo<Js::RecyclableObject>(instance);
  this_00 = RecyclableObject::GetScriptContext(this);
  threadContext = ScriptContext::GetThreadContext(this_00);
  JsReentLock::JsReentLock((JsReentLock *)local_38,threadContext);
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1e54,"(!TaggedNumber::Is(instance))","Invalid scope/root object")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  EnsureProperty(instance,reentrancylock._28_4_);
  JsReentLock::~JsReentLock((JsReentLock *)local_38);
  return;
}

Assistant:

void JavascriptOperators::OP_LoadUndefinedToElement(Var instance, PropertyId propertyId)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LdElemUndef, reentrancylock, VarTo<RecyclableObject>(instance)->GetScriptContext()->GetThreadContext());
        AssertMsg(!TaggedNumber::Is(instance), "Invalid scope/root object");
        JavascriptOperators::EnsureProperty(instance, propertyId);
        JIT_HELPER_END(Op_LdElemUndef);
    }